

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManFlowMinCut(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  void *Entry;
  int i;
  
  p_00 = Vec_PtrAlloc(p->nRegs);
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    Entry = Vec_PtrEntry(p->vObjs,i);
    if ((((Entry != (void *)0x0) && (*(long *)((long)Entry + 0x28) != 0)) &&
        (*(int *)((long)Entry + 0x20) == p->nTravIds)) &&
       (((*(byte *)((long)Entry + 0x18) & 0x10) != 0 ||
        (*(int *)(*(long *)((long)Entry + 0x28) + 0x20) != *(int *)((long)Entry + 0x20))))) {
      Vec_PtrPush(p_00,Entry);
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Llb_ManFlowMinCut( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    // collect the cut nodes
    vMinCut = Vec_PtrAlloc( Aig_ManRegNum(p) );
    Aig_ManForEachObj( p, pObj, i )
    {
        // node without flow is not a cut node
        if ( !Llb_ObjGetPath(pObj) )
            continue;
        // unvisited node is below the cut
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        // add terminal with flow or node whose path is not visited
        if ( pObj->fMarkA || !Aig_ObjIsTravIdCurrent( p, Llb_ObjGetPath(pObj) ) )
            Vec_PtrPush( vMinCut, pObj );
    }
    return vMinCut;
}